

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CMoveStatement *statement)

{
  CExpression *pCVar1;
  pointer pCVar2;
  CMoveStatement *pCVar3;
  CEseqExpression *pCVar4;
  CSeqStatement *pCVar5;
  CStatement *pCVar6;
  long local_118;
  CEseqExpression *local_108;
  CEseqFloatVisitor local_e0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c0;
  undefined1 local_b2;
  undefined1 local_b1;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_98;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_88;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_80;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_78;
  CEseqFloatVisitor local_70;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_50;
  long local_48;
  CEseqExpression *sourceEseq;
  CEseqExpression *targetEseq;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> source;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> target;
  CMoveStatement *statement_local;
  CEseqFloatVisitor *this_local;
  
  target._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )statement;
  pCVar1 = CMoveStatement::Target(statement);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&this->childExpression);
  pCVar1 = CMoveStatement::Source
                     ((CMoveStatement *)
                      target._M_t.
                      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &targetEseq,&this->childExpression);
  pCVar2 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get(&local_20);
  if (pCVar2 == (pointer)0x0) {
    local_108 = (CEseqExpression *)0x0;
  }
  else {
    local_108 = (CEseqExpression *)
                __dynamic_cast(pCVar2,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  sourceEseq = local_108;
  pCVar2 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           get((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &targetEseq);
  if (pCVar2 == (pointer)0x0) {
    local_118 = 0;
  }
  else {
    local_118 = __dynamic_cast(pCVar2,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  local_48 = local_118;
  if ((sourceEseq == (CEseqExpression *)0x0) && (local_118 == 0)) {
    pCVar3 = (CMoveStatement *)operator_new(0x18);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 1;
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70.childExpressionList,&local_20);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70.childExpression,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &targetEseq);
    CMoveStatement::CMoveStatement
              (pCVar3,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_70.childExpressionList,&local_70.childExpression);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_50,(pointer)pCVar3);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,&local_50);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_50);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70.childExpression);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
                &local_70.childExpressionList);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  else if ((sourceEseq == (CEseqExpression *)0x0) && (local_118 != 0)) {
    pCVar4 = (CEseqExpression *)
             std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
             get(&local_20);
    processSourceEseqInCMove(&local_70,(CExpression *)this,pCVar4);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_70);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_70);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  else if ((sourceEseq == (CEseqExpression *)0x0) || (local_118 != 0)) {
    if ((sourceEseq == (CEseqExpression *)0x0) || (local_118 == 0)) {
      local_70.childStatement._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 0;
    }
    else {
      pCVar5 = (CSeqStatement *)operator_new(0x18);
      pCVar6 = CEseqExpression::getStatement(sourceEseq);
      (*(pCVar6->super_IStatement).super_INode._vptr_INode[3])(&local_e0.childExpression);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_e0.childExpressionList,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_e0.childExpression);
      pCVar4 = (CEseqExpression *)
               std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ::get(&local_20);
      processSourceEseqInCMove(&local_e0,(CExpression *)this,pCVar4);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      unique_ptr(&local_e0.childStatement,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_e0);
      CSeqStatement::CSeqStatement
                (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_e0.childExpressionList,&local_e0.childStatement);
      std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
      unique_ptr<std::default_delete<IRT::CStatement_const>,void>
                ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
                 &local_c0,(pointer)pCVar5);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
                (&this->childStatement,&local_c0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_c0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr(&local_e0.childStatement);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_e0);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_e0.childExpressionList);
      std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::
      ~unique_ptr((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                  &local_e0.childExpression);
      local_70.childStatement._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
  else {
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    local_b2 = 1;
    pCVar6 = CEseqExpression::getStatement(sourceEseq);
    (*(pCVar6->super_IStatement).super_INode._vptr_INode[3])(&local_88);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_80,&local_88);
    pCVar3 = (CMoveStatement *)operator_new(0x18);
    local_b1 = 1;
    pCVar1 = CEseqExpression::getExpression(sourceEseq);
    (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(&local_a8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_a0,&local_a8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_b0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &targetEseq);
    CMoveStatement::CMoveStatement(pCVar3,&local_a0,&local_b0);
    local_b1 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_98,(pointer)pCVar3);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_90,&local_98);
    CSeqStatement::CSeqStatement(pCVar5,&local_80,&local_90);
    local_b2 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_78,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
              (&this->childStatement,&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_90);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_98);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_b0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_a0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_a8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_80);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_88);
    local_70.childStatement._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &targetEseq);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CMoveStatement &statement) {
    statement.Target()->Accept(*this);
    std::unique_ptr<const CExpression> target = std::move(childExpression);

    statement.Source()->Accept(*this);
    std::unique_ptr<const CExpression> source = std::move(childExpression);

    const CEseqExpression* targetEseq = dynamic_cast<const CEseqExpression*>(target.get());
    const CEseqExpression* sourceEseq = dynamic_cast<const CEseqExpression*>(source.get());

    if (targetEseq == nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CMoveStatement(
                std::move(target),
                std::move(source)
        ));

        return;
    }

    if (targetEseq == nullptr && sourceEseq != nullptr) {
        childStatement = std::move(processSourceEseqInCMove(target.get(), sourceEseq));

        return;
    }

    if (targetEseq != nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CMoveStatement(
                        std::move(targetEseq->getExpression()->Copy()),
                        std::move(source)
                ))
        ));

        return;
    }

    if (targetEseq != nullptr && sourceEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                std::move(processSourceEseqInCMove(target.get(), sourceEseq))
        ));

        return;
    }
}